

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlSAXParseFile(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlSAXHandlerPtr SAX;
  PyObject *pyobj_SAX;
  char *URI;
  PyObject *pPStack_20;
  int recover;
  PyObject *args_local;
  PyObject *self_local;
  
  SAX = (xmlSAXHandlerPtr)0x0;
  pPStack_20 = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"Osi:xmlSAXParseFile",&SAX,&pyobj_SAX,(long)&URI + 4);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else if (SAX == (xmlSAXHandlerPtr)&_Py_NoneStruct) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    self_local = (PyObject *)&_Py_NoneStruct;
  }
  else {
    _Py_INCREF((PyObject *)SAX);
    xmlSAXUserParseFile(&pythonSaxHandler,SAX,pyobj_SAX);
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    self_local = (PyObject *)&_Py_NoneStruct;
  }
  return self_local;
}

Assistant:

PyObject *
libxml_xmlSAXParseFile(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
#ifdef LIBXML_SAX1_ENABLED
    int recover;
    const char *URI;
    PyObject *pyobj_SAX = NULL;
    xmlSAXHandlerPtr SAX = NULL;

    if (!PyArg_ParseTuple(args, (char *) "Osi:xmlSAXParseFile", &pyobj_SAX,
                          &URI, &recover))
        return (NULL);

#ifdef DEBUG
    printf("libxml_xmlSAXParseFile(%p, %s, %d) called\n",
           pyobj_SAX, URI, recover);
#endif
    if (pyobj_SAX == Py_None) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    SAX = &pythonSaxHandler;
    Py_INCREF(pyobj_SAX);
    /* The reference is released in pythonEndDocument() */
    xmlSAXUserParseFile(SAX, pyobj_SAX, URI);
#endif /* LIBXML_SAX1_ENABLED */
    Py_INCREF(Py_None);
    return (Py_None);
}